

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void av1_tf_info_filtering(TEMPORAL_FILTER_INFO *tf_info,AV1_COMP *cpi,GF_GROUP *gf_group)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  AV1_COMP *in_RSI;
  int *in_RDI;
  YV12_BUFFER_CONFIG *out_buf;
  int lookahead_idx;
  int buf_idx;
  int update_type;
  int gf_index;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffbc;
  YV12_BUFFER_CONFIG *ybf;
  int iVar4;
  AV1_COMMON *cm_00;
  
  if (*in_RDI != 0) {
    cm_00 = &in_RSI->common;
    for (iVar4 = 0; iVar4 < *(int *)(in_RDX + 0x1878); iVar4 = iVar4 + 1) {
      uVar1 = (uint)*(byte *)(in_RDX + iVar4);
      if ((uVar1 == 0) || (uVar1 == 3)) {
        uVar2 = (uint)(*(char *)(in_RDX + 0x1680 + (long)iVar4) == '\x01');
        iVar3 = (uint)*(byte *)(in_RDX + 0xfa + (long)iVar4) +
                (uint)*(byte *)(in_RDX + 500 + (long)iVar4);
        if ((in_RDI[(long)(int)uVar2 + 0xaa] == 0) || (in_RDI[(long)(int)uVar2 + 0xa8] != iVar3)) {
          ybf = (YV12_BUFFER_CONFIG *)(in_RDI + (long)(int)uVar2 * 0x34 + 2);
          av1_temporal_filter(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(FRAME_DIFF *)cm_00,
                              (YV12_BUFFER_CONFIG *)CONCAT44(iVar4,uVar1));
          av1_num_planes(cm_00);
          aom_extend_frame_borders_c(ybf,in_stack_ffffffffffffffbc);
          in_RDI[(long)(int)uVar2 + 0xa6] = iVar4;
          in_RDI[(long)(int)uVar2 + 0xa8] = iVar3;
          in_RDI[(long)(int)uVar2 + 0xaa] = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_tf_info_filtering(TEMPORAL_FILTER_INFO *tf_info, AV1_COMP *cpi,
                           const GF_GROUP *gf_group) {
  if (tf_info->is_temporal_filter_on == 0) return;
  const AV1_COMMON *const cm = &cpi->common;
  for (int gf_index = 0; gf_index < gf_group->size; ++gf_index) {
    int update_type = gf_group->update_type[gf_index];
    if (update_type == KF_UPDATE || update_type == ARF_UPDATE) {
      int buf_idx = gf_group->frame_type[gf_index] == INTER_FRAME;
      int lookahead_idx = gf_group->arf_src_offset[gf_index] +
                          gf_group->cur_frame_idx[gf_index];
      // This function is designed to be called multiple times after
      // av1_tf_info_reset(). It will only generate the filtered frame that does
      // not exist yet.
      if (tf_info->tf_buf_valid[buf_idx] == 0 ||
          tf_info->tf_buf_display_index_offset[buf_idx] != lookahead_idx) {
        YV12_BUFFER_CONFIG *out_buf = &tf_info->tf_buf[buf_idx];
        av1_temporal_filter(cpi, lookahead_idx, gf_index,
                            &tf_info->frame_diff[buf_idx], out_buf);
        aom_extend_frame_borders(out_buf, av1_num_planes(cm));
        tf_info->tf_buf_gf_index[buf_idx] = gf_index;
        tf_info->tf_buf_display_index_offset[buf_idx] = lookahead_idx;
        tf_info->tf_buf_valid[buf_idx] = 1;
      }
    }
  }
}